

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int attr_count(attr_list list)

{
  attr_list *pp_Var1;
  int_attr_struct *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = 0;
  if (list != (attr_list)0x0) {
    if (list->list_of_lists == 0) {
      piVar2 = (list->l).list.iattrs;
      iVar4 = (uint)piVar2->other_attr_count + (uint)piVar2->int_attr_count;
    }
    else {
      lVar6 = (long)(list->l).lists.sublist_count;
      iVar4 = 0;
      if (0 < lVar6) {
        pp_Var1 = (list->l).lists.lists;
        lVar5 = 0;
        iVar4 = 0;
        do {
          iVar3 = attr_count(pp_Var1[lVar5]);
          iVar4 = iVar4 + iVar3;
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
      }
    }
  }
  return iVar4;
}

Assistant:

extern
int 
attr_count(attr_list list)
{
    if (list == NULL) return 0;
    if (!list->list_of_lists) {
        return list->l.list.iattrs->int_attr_count +
	    list->l.list.iattrs->other_attr_count;
    } else {
        int count = 0;
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            count += attr_count(list->l.lists.lists[i]);
        }
        return count;
    }           
}